

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

VkSamplerYcbcrConversionCreateInfo * __thiscall
Fossilize::StateRecorder::Impl::copy<VkSamplerYcbcrConversionCreateInfo>
          (Impl *this,VkSamplerYcbcrConversionCreateInfo *src,size_t count,ScratchAllocator *alloc)

{
  VkSamplerYcbcrConversionCreateInfo *new_data;
  ScratchAllocator *alloc_local;
  size_t count_local;
  VkSamplerYcbcrConversionCreateInfo *src_local;
  Impl *this_local;
  
  if (count == 0) {
    this_local = (Impl *)0x0;
  }
  else {
    this_local = (Impl *)ScratchAllocator::allocate_n<VkSamplerYcbcrConversionCreateInfo>
                                   (alloc,count);
    if (this_local != (Impl *)0x0) {
      std::copy<VkSamplerYcbcrConversionCreateInfo_const*,VkSamplerYcbcrConversionCreateInfo*>
                (src,src + count,(VkSamplerYcbcrConversionCreateInfo *)this_local);
    }
  }
  return (VkSamplerYcbcrConversionCreateInfo *)this_local;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}